

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

void deqp::gles3::Functional::computeReference<(glu::TextureTestUtil::TextureType)1>
               (t *texture,float lod,Sampler *sampler,
               PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *grid,Surface *dst,
               Rect *dstRegion)

{
  int iVar1;
  TextureFormat *pTVar2;
  undefined1 local_90 [16];
  Sampler *local_80;
  t *coord;
  int ndx;
  int x;
  int y;
  allocator<tcu::Vector<float,_4>_> local_59;
  undefined1 local_58 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> quadColors;
  int gridSize;
  Rect *dstRegion_local;
  Surface *dst_local;
  PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *grid_local;
  Sampler *sampler_local;
  float lod_local;
  t *texture_local;
  
  quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::getSize(grid);
  iVar1 = quadColors.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_ *
          quadColors.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_59);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58,
             (long)iVar1,&local_59);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_59);
  for (ndx = 0; ndx < quadColors.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; ndx = ndx + 1) {
    for (coord._4_4_ = 0;
        coord._4_4_ <
        quadColors.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; coord._4_4_ = coord._4_4_ + 1) {
      coord._0_4_ = ndx * quadColors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + coord._4_4_;
      local_80 = (Sampler *)
                 anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::
                 getQuadTexCoord(grid,coord._4_4_,ndx);
      sample((TextureCube *)local_90,(Vec3 *)texture,lod,local_80);
      pTVar2 = (TextureFormat *)
               std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_58,(long)(int)coord);
      pTVar2->order = local_90._0_4_;
      pTVar2->type = local_90._4_4_;
      pTVar2[1].order = local_90._8_4_;
      pTVar2[1].type = local_90._12_4_;
    }
  }
  setPixelColors<(glu::TextureTestUtil::TextureType)1>
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58,
             dstRegion,grid,dst);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_58);
  return;
}

Assistant:

void computeReference (const typename TexTypeTcuClass<TexType>::t& texture, float lod, const tcu::Sampler& sampler, const PosTexCoordQuadGrid<TexType>& grid, tcu::Surface& dst, const Rect& dstRegion)
{
	const int		gridSize	= grid.getSize();
	vector<Vec4>	quadColors	(gridSize*gridSize);

	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		const int										ndx		= y*gridSize + x;
		const typename TexTypeCoordVec<TexType>::t&		coord	= grid.getQuadTexCoord(x, y);

		quadColors[ndx] = sample(texture, coord, lod, sampler);
	}

	setPixelColors(quadColors, dstRegion, grid, dst);
}